

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O3

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  QByteArray *pQVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  iterator iVar4;
  undefined4 in_register_00000034;
  QList<QByteArray> *this_00;
  char *pcVar5;
  long in_FS_OFFSET;
  QByteArray local_40;
  long local_28;
  
  this_00 = (QList<QByteArray> *)CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this_00->d).size != 0) && (0 < (long)this_00[1].d.ptr)) {
    iVar4 = QList<QByteArray>::begin(this_00);
    pQVar1 = this_00[1].d.ptr;
    pcVar5 = ((iVar4.i)->d).ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    QByteArray::QByteArray(&local_40,pcVar5 + (long)pQVar1,((iVar4.i)->d).size - (long)pQVar1);
    pQVar2 = &(((iVar4.i)->d).d)->super_QArrayData;
    ((iVar4.i)->d).d = local_40.d.d;
    pcVar5 = ((iVar4.i)->d).ptr;
    ((iVar4.i)->d).ptr = local_40.d.ptr;
    qVar3 = ((iVar4.i)->d).size;
    ((iVar4.i)->d).size = local_40.d.size;
    local_40.d.d = (Data *)pQVar2;
    local_40.d.ptr = pcVar5;
    local_40.d.size = qVar3;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,1,0x10);
      }
    }
    this_00[1].d.ptr = (QByteArray *)0x0;
  }
  iVar4 = QList<QByteArray>::begin(this_00);
  this_00[1].d.d = (Data *)((long)this_00[1].d.d - ((iVar4.i)->d).size);
  QList<QByteArray>::takeFirst((value_type *)this,this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (ssize_t)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QByteArray read()
    {
        Q_ASSERT(!isEmpty());
        squeezeFirst();
        bufferCompleteSize -= buffers.first().size();
        return buffers.takeFirst();
    }